

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrokeTests.cpp
# Opt level: O2

void __thiscall
agge::tests::PathStrokeTests::HorizontalLineIsTransformedToARect(PathStrokeTests *this)

{
  undefined4 uVar1;
  int iVar2;
  allocator local_1e1;
  stroke s;
  undefined1 local_188 [32];
  int local_168;
  point local_164;
  point local_158;
  point local_14c;
  undefined1 local_138 [24];
  point local_120;
  point local_114;
  point local_108;
  point local_fc;
  point local_e8;
  point local_dc;
  point local_d0;
  point local_c4;
  point local_b8;
  point local_ac;
  point local_98;
  undefined8 local_8c;
  undefined4 local_84;
  undefined8 local_80;
  undefined4 local_78;
  undefined8 local_74;
  undefined4 local_6c;
  undefined8 local_68;
  undefined4 local_60;
  undefined8 local_5c;
  undefined4 local_54;
  string local_50;
  LocationInfo local_30;
  
  stroke::stroke(&s);
  stroke::width(&s,2.1);
  local_e8._0_8_ = &PTR__cap_001d5288;
  stroke::set_cap<agge::caps::butt>(&s,(butt *)&local_e8);
  move_to<agge::stroke>(&s,1.3,5.81);
  uVar1 = 2;
  stroke::add_vertex(&s,7.1,5.81,2);
  local_e8 = vertex<agge::stroke>(&s);
  local_dc = vertex<agge::stroke>(&s);
  local_d0 = vertex<agge::stroke>(&s);
  local_c4 = vertex<agge::stroke>(&s);
  local_b8 = vertex<agge::stroke>(&s);
  local_ac = vertex<agge::stroke>(&s);
  local_98.x = 1.3;
  local_98.y = 6.86;
  local_98.command = 1;
  local_8c = 0x409851ec3fa66666;
  local_80 = 0x409851ec40e33333;
  local_74 = 0x40db851f40e33333;
  local_68 = 0;
  local_60 = 0x30;
  local_5c = 0;
  local_54 = 0;
  local_84 = uVar1;
  local_78 = uVar1;
  local_6c = uVar1;
  std::__cxx11::string::string
            ((string *)local_188,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/StrokeTests.cpp"
             ,(allocator *)&local_30);
  ut::LocationInfo::LocationInfo((LocationInfo *)local_138,(string *)local_188,0x6d);
  ut::are_equal<agge::tests::mocks::path::point,agge::tests::mocks::path::point,6ul>
            ((point (*) [6])&local_98,(point (*) [6])&local_e8,(LocationInfo *)local_138);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  stroke::width(&s,1.5);
  stroke::remove_all(&s);
  move_to<agge::stroke>(&s,108.3,-15.1);
  iVar2 = 2;
  stroke::add_vertex(&s,-5.0,-15.1,2);
  local_138._0_12_ = (undefined1  [12])vertex<agge::stroke>(&s);
  local_138._12_12_ = (undefined1  [12])vertex<agge::stroke>(&s);
  local_120 = vertex<agge::stroke>(&s);
  local_114 = vertex<agge::stroke>(&s);
  local_108 = vertex<agge::stroke>(&s);
  local_fc = vertex<agge::stroke>(&s);
  local_188._0_8_ = (pointer)0xc17d999a42d8999a;
  local_188._8_4_ = 1;
  local_188._12_4_ = 108.3;
  local_188._16_4_ = -14.35;
  local_188._24_8_ = 0xc165999ac0a00000;
  local_164.x = -5.0;
  local_164.y = -15.85;
  local_158.x = 0.0;
  local_158.y = 0.0;
  local_158.command = 0x30;
  local_14c.x = 0.0;
  local_14c.y = 0.0;
  local_14c.command = 0;
  local_188._20_4_ = iVar2;
  local_168 = iVar2;
  local_164.command = iVar2;
  std::__cxx11::string::string
            ((string *)&local_50,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/StrokeTests.cpp"
             ,&local_1e1);
  ut::LocationInfo::LocationInfo(&local_30,&local_50,0x80);
  ut::are_equal<agge::tests::mocks::path::point,agge::tests::mocks::path::point,6ul>
            ((point (*) [6])local_188,(point (*) [6])local_138,&local_30);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  stroke::~stroke(&s);
  return;
}

Assistant:

test( HorizontalLineIsTransformedToARect )
			{
				// INIT
				stroke s;

				s.width(2.1f);
				s.set_cap(caps::butt());

				// ACT
				move_to(s, 1.3f, 5.81f);
				line_to(s, 7.1f, 5.81f);
				mocks::path::point points1[] = { vertex(s), vertex(s), vertex(s), vertex(s), vertex(s), vertex(s), };

				// ASSERT
				mocks::path::point reference1[] = {
					moveto(1.3f, 6.86f), lineto(1.3f, 4.76f),
					lineto(7.1f, 4.76f), lineto(7.1f, 6.86f),
					{ 0.0f, 0.0f, path_command_end_poly | path_flag_close },
					{ 0.0f, 0.0f, path_command_stop },
				};

				assert_equal(reference1, points1);

				// INIT
				s.width(1.5f);
				s.remove_all();

				// ACT
				move_to(s, 108.3f, -15.1f);
				line_to(s, -5.0f, -15.1f);
				mocks::path::point points2[] = { vertex(s), vertex(s), vertex(s), vertex(s), vertex(s), vertex(s), };

				// ASSERT
				mocks::path::point reference2[] = {
					moveto(108.3f, -15.85f), lineto(108.3f, -14.35f),
					lineto(-5.0f, -14.35f), lineto(-5.0f, -15.85f),
					{ 0.0f, 0.0f, path_command_end_poly | path_flag_close },
					{ 0.0f, 0.0f, path_command_stop },
				};

				assert_equal(reference2, points2);
			}